

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void av1_get_upsampled_plane_size(AV1_COMMON *cm,int is_uv,int *plane_w,int *plane_h)

{
  bool bVar1;
  bool bVar2;
  
  if (is_uv == 0) {
    bVar1 = false;
    bVar2 = false;
  }
  else {
    bVar1 = cm->seq_params->subsampling_x != 0;
    bVar2 = cm->seq_params->subsampling_y != 0;
  }
  *plane_w = (int)(((uint)(1 << bVar1) >> 1) + cm->superres_upscaled_width) >> bVar1;
  *plane_h = (int)(((uint)(1 << bVar2) >> 1) + cm->height) >> bVar2;
  return;
}

Assistant:

void av1_get_upsampled_plane_size(const AV1_COMMON *cm, int is_uv, int *plane_w,
                                  int *plane_h) {
  int ss_x = is_uv && cm->seq_params->subsampling_x;
  int ss_y = is_uv && cm->seq_params->subsampling_y;
  *plane_w = ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  *plane_h = ROUND_POWER_OF_TWO(cm->height, ss_y);
}